

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.cpp
# Opt level: O0

void anon_unknown.dwarf_f2ef::string_arg(string *option,int i,int argc,char **argv,char *arg)

{
  char *arg_local;
  char **argv_local;
  int argc_local;
  int i_local;
  string *option_local;
  
  if (i == argc) {
    insufficient_args(arg);
  }
  std::__cxx11::string::operator=((string *)option,argv[i]);
  return;
}

Assistant:

void string_arg(std::string &option, int i,
    int argc, char *argv[], const char *arg)
{
    if (i == argc)
    {
        insufficient_args(arg);
    }
    option = argv[i];
}